

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall testing::internal::Arguments::~Arguments(Arguments *this)

{
  pointer ppcVar1;
  
  for (ppcVar1 = (this->args_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar1 !=
      (this->args_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar1 = ppcVar1 + 1) {
    free(*ppcVar1);
  }
  CLI::std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
            ((_Vector_base<char_*,_std::allocator<char_*>_> *)this);
  return;
}

Assistant:

~Arguments() {
    for (std::vector<char*>::iterator i = args_.begin(); i != args_.end();
         ++i) {
      free(*i);
    }
  }